

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

string * __thiscall
helics::CoreApp::query_abi_cxx11_
          (CoreApp *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __shared_ptr *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffff8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  JsonErrorCodes code;
  
  code = (JsonErrorCodes)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  bVar3 = 0;
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x44b327);
    (*peVar2->_vptr_Core[0x5e])(in_RDI,peVar2,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  }
  else {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(1,in_stack_ffffffffffffff88)),
               in_stack_ffffffffffffff80);
    generateJsonErrorResponse(code,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  }
  return in_RDI;
}

Assistant:

std::string
    CoreApp::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    return (core) ? core->query(target, queryStr, mode) :
                    generateJsonErrorResponse(JsonErrorCodes::BAD_GATEWAY, "Core not available");
}